

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O0

int ebur128_relative_threshold(ebur128_state *st,double *out)

{
  double dVar1;
  undefined1 auVar2 [16];
  size_t local_30;
  size_t above_thresh_counter;
  double relative_threshold;
  double *out_local;
  ebur128_state *st_local;
  
  above_thresh_counter = 0;
  local_30 = 0;
  if ((st->mode & 5U) == 5) {
    relative_threshold = (double)out;
    out_local = (double *)st;
    ebur128_calc_relative_threshold(st,&local_30,(double *)&above_thresh_counter);
    if (local_30 == 0) {
      *(undefined8 *)relative_threshold = 0xc051800000000000;
      st_local._4_4_ = 0;
    }
    else {
      auVar2._8_4_ = (int)(local_30 >> 0x20);
      auVar2._0_8_ = local_30;
      auVar2._12_4_ = 0x45300000;
      above_thresh_counter =
           (size_t)(relative_gate_factor *
                   ((double)above_thresh_counter /
                   ((auVar2._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_30) - 4503599627370496.0))));
      dVar1 = ebur128_energy_to_loudness((double)above_thresh_counter);
      *(double *)relative_threshold = dVar1;
      st_local._4_4_ = 0;
    }
  }
  else {
    st_local._4_4_ = 2;
  }
  return st_local._4_4_;
}

Assistant:

int ebur128_relative_threshold(ebur128_state* st, double* out) {
  double relative_threshold = 0.0;
  size_t above_thresh_counter = 0;

  if ((st->mode & EBUR128_MODE_I) != EBUR128_MODE_I) {
    return EBUR128_ERROR_INVALID_MODE;
  }

  ebur128_calc_relative_threshold(st, &above_thresh_counter,
                                  &relative_threshold);

  if (!above_thresh_counter) {
    *out = -70.0;
    return EBUR128_SUCCESS;
  }

  relative_threshold /= (double) above_thresh_counter;
  relative_threshold *= relative_gate_factor;

  *out = ebur128_energy_to_loudness(relative_threshold);
  return EBUR128_SUCCESS;
}